

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype __thiscall QtPrivate::count(QtPrivate *this,QStringView haystack,QRegularExpression *re)

{
  bool bVar1;
  QRegularExpression *this_00;
  qsizetype qVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QStringView subjectView;
  QRegularExpressionMatch match;
  QString local_50;
  long local_38;
  
  this_00 = (QRegularExpression *)haystack.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QRegularExpression::isValid(this_00);
  if (bVar1) {
    if (-1 < (long)this) {
      qVar3 = -1;
      qVar2 = 0;
      do {
        local_50.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        subjectView.m_data = (storage_type_conflict *)this;
        subjectView.m_size = (qsizetype)this_00;
        QRegularExpression::matchView
                  ((QRegularExpression *)&local_50,subjectView,haystack.m_size,
                   (int)qVar3 + PartialPreferCompleteMatch,(MatchOptions)0x0);
        bVar1 = QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)&local_50);
        if (!bVar1) {
          QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_50);
          break;
        }
        qVar3 = QRegularExpressionMatch::capturedStart((QRegularExpressionMatch *)&local_50,0);
        if (qVar3 < (long)this) {
          qVar3 = qVar3 + (ulong)((*(ushort *)(haystack.m_size + qVar3 * 2) & 0xfc00) == 0xd800);
        }
        QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_50);
        qVar2 = qVar2 + 1;
      } while (qVar3 < (long)this);
      goto LAB_003296ee;
    }
  }
  else {
    QRegularExpression::pattern(&local_50,this_00);
    qtWarnAboutInvalidRegularExpression(&local_50,"QString(View)::count");
    count((QtPrivate *)&local_50);
  }
  qVar2 = 0;
LAB_003296ee:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar2;
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, const QRegularExpression &re)
{
    if (!re.isValid()) {
        qtWarnAboutInvalidRegularExpression(re.pattern(), "QString(View)::count");
        return 0;
    }
    qsizetype count = 0;
    qsizetype index = -1;
    qsizetype len = haystack.size();
    while (index <= len - 1) {
        QRegularExpressionMatch match = re.matchView(haystack, index + 1);
        if (!match.hasMatch())
            break;
        count++;

        // Search again, from the next character after the beginning of this
        // capture. If the capture starts with a surrogate pair, both together
        // count as "one character".
        index = match.capturedStart();
        if (index < len && haystack[index].isHighSurrogate())
            ++index;
    }
    return count;
}